

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroup::TemplatedScan<(duckdb::TableScanType)2>
          (RowGroup *this,TransactionData transaction,CollectionScanState *state,DataChunk *result)

{
  double *pdVar1;
  idx_t *piVar2;
  BlockManager *pBVar3;
  pointer pSVar4;
  size_type __n;
  data_ptr_t pdVar5;
  idx_t iVar6;
  _Head_base<0UL,_duckdb::ColumnScanState_*,_false> _Var7;
  ScanFilterInfo *pSVar8;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  bool bVar10;
  bool bVar11;
  FilterPropagateResult FVar12;
  int iVar13;
  const_reference pvVar14;
  ColumnData *pCVar15;
  AdaptiveFilterState state_00;
  AdaptiveFilter *this_00;
  reference pvVar16;
  const_reference pvVar17;
  type filter_state;
  reference pvVar18;
  ulong uVar19;
  idx_t i_1;
  __atomic_base<unsigned_long> this_01;
  idx_t iVar20;
  ulong uVar21;
  _func_int **pp_Var22;
  TableScanState *pTVar23;
  idx_t i;
  ulong uVar24;
  pointer pSVar25;
  long lVar26;
  element_type *count;
  double dVar27;
  optional_ptr<duckdb::DuckTransaction,_true> in_stack_fffffffffffffec8;
  idx_t approved_tuple_count;
  DataChunk *local_f8;
  element_type *local_f0;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __atomic_base<unsigned_long> local_e0;
  TableScanState *local_d8;
  vector<duckdb::StorageIndex,_true> *local_d0;
  SelectionVector sel;
  optional_ptr<duckdb::AdaptiveFilter,_true> adaptive_filter;
  PrefetchState prefetch_state;
  
  pTVar23 = state->parent;
  local_d0 = &pTVar23->column_ids;
  this_01._M_i = (__int_type)&pTVar23->filters;
  pSVar8 = &pTVar23->filters;
  local_f8 = result;
  local_e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)state;
  local_e0._M_i = this_01._M_i;
  local_d8 = pTVar23;
  do {
    _Var9._M_pi = local_e8._M_pi;
    pp_Var22 = (_func_int **)(*(idx_t *)&(local_e8._M_pi)->_M_use_count * 0x800);
    local_f0 = (element_type *)
               (local_e8._M_pi[1]._vptr__Sp_counted_base +
               *(idx_t *)&(local_e8._M_pi)->_M_use_count * -0x100);
    if (local_e8._M_pi[1]._vptr__Sp_counted_base < pp_Var22 || local_f0 == (element_type *)0x0) {
      return;
    }
    if ((element_type *)0x7ff < local_f0) {
      local_f0 = (element_type *)0x800;
    }
    if (((((TableScanState *)local_e8._M_pi[8]._vptr__Sp_counted_base)->sampling_info).
         do_system_sample != true) ||
       (dVar27 = RandomEngine::NextRandom(&state->random),
       pdVar1 = &(((TableScanState *)_Var9._M_pi[8]._vptr__Sp_counted_base)->sampling_info).
                 sample_rate, dVar27 < *pdVar1 || dVar27 == *pdVar1)) {
      bVar10 = CheckZonemapSegments(this,(CollectionScanState *)_Var9._M_pi);
      bVar11 = true;
      if (bVar10) {
        pBVar3 = ((this->collection)._M_data)->block_manager;
        iVar13 = (*pBVar3->_vptr_BlockManager[0x12])(pBVar3);
        if ((char)iVar13 != '\0') {
          prefetch_state.blocks.
          super_vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
          .
          super__Vector_base<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          prefetch_state.blocks.
          super_vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
          .
          super__Vector_base<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          prefetch_state.blocks.
          super_vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
          .
          super__Vector_base<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          lVar26 = 0;
          for (uVar24 = 0;
              uVar24 < (ulong)((long)(pTVar23->column_ids).
                                     super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     .
                                     super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pTVar23->column_ids).
                                     super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     .
                                     super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar24 = uVar24 + 1) {
            pvVar14 = vector<duckdb::StorageIndex,_true>::get<true>(local_d0,uVar24);
            if (pvVar14->index != 0xffffffffffffffff) {
              pCVar15 = GetColumn(this,pvVar14);
              (*pCVar15->_vptr_ColumnData[6])
                        (pCVar15,&prefetch_state,
                         (long)&((((unsafe_unique_array<ColumnScanState> *)
                                  &local_e8._M_pi[1]._M_use_count)->
                                 super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                                 )._M_t.
                                 super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                                 .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>.
                                _M_head_impl)->current + lVar26,local_f0);
            }
            lVar26 = lVar26 + 0x98;
          }
          (*pBVar3->buffer_manager->_vptr_BufferManager[8])(pBVar3->buffer_manager,&prefetch_state);
          PrefetchState::~PrefetchState(&prefetch_state);
        }
        bVar11 = ScanFilterInfo::HasFilters((ScanFilterInfo *)this_01._M_i);
        if (!bVar11) {
          lVar26 = 0;
          count = local_f0;
          for (uVar24 = 0;
              uVar24 < (ulong)((long)(pTVar23->column_ids).
                                     super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     .
                                     super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pTVar23->column_ids).
                                     super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     .
                                     super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar24 = uVar24 + 1) {
            pvVar14 = vector<duckdb::StorageIndex,_true>::get<true>(local_d0,uVar24);
            if (pvVar14->index == 0xffffffffffffffff) {
              pvVar18 = vector<duckdb::Vector,_true>::get<true>(&local_f8->data,uVar24);
              Vector::Sequence(pvVar18,(this->super_SegmentBase<duckdb::RowGroup>).start +
                                       (long)pp_Var22,1,(idx_t)count);
            }
            else {
              pCVar15 = GetColumn(this,pvVar14);
              iVar20 = *(idx_t *)&(local_e8._M_pi)->_M_use_count;
              _Var7._M_head_impl =
                   (((unsafe_unique_array<ColumnScanState> *)&local_e8._M_pi[1]._M_use_count)->
                   super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                   )._M_t.
                   super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                   .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl;
              pvVar18 = vector<duckdb::Vector,_true>::get<true>(&local_f8->data,uVar24);
              pTVar23 = local_d8;
              count = local_f0;
              ColumnData::ScanCommitted
                        (pCVar15,iVar20,
                         (ColumnScanState *)((long)&(_Var7._M_head_impl)->current + lVar26),pvVar18,
                         false);
            }
            lVar26 = lVar26 + 0x98;
          }
LAB_01aafbea:
          local_f8->count = (idx_t)local_f0;
          *(idx_t *)&(local_e8._M_pi)->_M_use_count = *(idx_t *)&(local_e8._M_pi)->_M_use_count + 1;
          return;
        }
        approved_tuple_count = (idx_t)local_f0;
        sel.sel_vector = (sel_t *)0x0;
        sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ::std::__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>::reset
                  ((__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> *)
                   &sel.selection_data);
        sel.sel_vector = (sel_t *)0x0;
        adaptive_filter.ptr =
             (pTVar23->filters).adaptive_filter.
             super_unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::AdaptiveFilter_*,_std::default_delete<duckdb::AdaptiveFilter>_>
             .super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>._M_head_impl;
        state_00 = ScanFilterInfo::BeginFilter((ScanFilterInfo *)this_01._M_i);
        uVar24 = 0;
        while( true ) {
          pSVar25 = (pTVar23->filters).filter_list.
                    super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                    super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pSVar4 = (pTVar23->filters).filter_list.
                   super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                   super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if ((ulong)(((long)pSVar4 - (long)pSVar25) / 0x28) <= uVar24) break;
          this_00 = optional_ptr<duckdb::AdaptiveFilter,_true>::operator->(&adaptive_filter);
          pvVar16 = vector<unsigned_long,_true>::get<true>(&this_00->permutation,uVar24);
          pvVar17 = vector<duckdb::ScanFilter,_true>::get<true>(&pSVar8->filter_list,*pvVar16);
          if (pvVar17->always_true == false) {
            filter_state = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                           ::operator*(&pvVar17->filter_state);
            __n = pvVar17->scan_column_index;
            iVar20 = pvVar17->table_column_index;
            pvVar18 = vector<duckdb::Vector,_true>::get<true>(&local_f8->data,__n);
            if (iVar20 == 0xffffffffffffffff) {
              iVar20 = (this->super_SegmentBase<duckdb::RowGroup>).start + (long)pp_Var22;
              FVar12 = CheckRowIdFilter(pvVar17->filter,iVar20,iVar20 + (long)local_f0);
              pTVar23 = local_d8;
              if (FVar12 == FILTER_ALWAYS_FALSE) {
                approved_tuple_count = 0;
              }
              else {
                Vector::SetVectorType(pvVar18,FLAT_VECTOR);
                pdVar5 = pvVar18->data;
                for (uVar19 = 0; uVar19 < approved_tuple_count; uVar19 = uVar19 + 1) {
                  uVar21 = uVar19;
                  if (sel.sel_vector != (sel_t *)0x0) {
                    uVar21 = (ulong)sel.sel_vector[uVar19];
                  }
                  *(ulong *)(pdVar5 + uVar21 * 8) =
                       (long)pp_Var22 + uVar21 + (this->super_SegmentBase<duckdb::RowGroup>).start;
                }
                if (FVar12 != FILTER_ALWAYS_TRUE) {
                  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&prefetch_state);
                  Vector::ToUnifiedFormat
                            (pvVar18,approved_tuple_count,(UnifiedVectorFormat *)&prefetch_state);
                  in_stack_fffffffffffffec8.ptr = (DuckTransaction *)&approved_tuple_count;
                  ColumnSegment::FilterSelection
                            (&sel,pvVar18,(UnifiedVectorFormat *)&prefetch_state,pvVar17->filter,
                             filter_state,approved_tuple_count,
                             (idx_t *)in_stack_fffffffffffffec8.ptr);
                  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&prefetch_state);
                }
              }
            }
            else {
              pCVar15 = GetColumn(this,pvVar17->table_column_index);
              pTVar23 = local_d8;
              in_stack_fffffffffffffec8.ptr = transaction.transaction.ptr;
              (*pCVar15->_vptr_ColumnData[0xd])
                        (pCVar15,*(idx_t *)&(local_e8._M_pi)->_M_use_count,
                         (((unsafe_unique_array<ColumnScanState> *)&local_e8._M_pi[1]._M_use_count)
                         ->
                         super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                         )._M_t.
                         super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                         .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl + __n
                         ,pvVar18,&sel,&approved_tuple_count,transaction.transaction.ptr,
                         transaction.transaction_id,transaction.start_time,pvVar17->filter,
                         filter_state);
            }
          }
          uVar24 = uVar24 + 1;
        }
        for (; iVar20 = approved_tuple_count, pSVar25 != pSVar4; pSVar25 = pSVar25 + 1) {
          if (pSVar25->always_true == false) {
            pvVar18 = vector<duckdb::Vector,_true>::get<true>
                                (&local_f8->data,pSVar25->scan_column_index);
            Vector::Slice(pvVar18,&sel,approved_tuple_count);
          }
        }
        if (approved_tuple_count == 0) {
          DataChunk::Reset(local_f8);
          _Var9._M_pi = local_e8._M_pi;
          lVar26 = 0;
          for (uVar24 = 0;
              uVar24 < (ulong)((long)(pTVar23->column_ids).
                                     super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     .
                                     super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pTVar23->column_ids).
                                     super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     .
                                     super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar24 = uVar24 + 1) {
            pvVar14 = vector<duckdb::StorageIndex,_true>::get<true>(local_d0,uVar24);
            if ((pvVar14->index != 0xffffffffffffffff) &&
               (bVar11 = ScanFilterInfo::ColumnHasFilters((ScanFilterInfo *)local_e0._M_i,uVar24),
               !bVar11)) {
              pCVar15 = GetColumn(this,pvVar14);
              (*pCVar15->_vptr_ColumnData[0x10])
                        (pCVar15,(long)&((((unsafe_unique_array<ColumnScanState> *)
                                          &_Var9._M_pi[1]._M_use_count)->
                                         super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                                         )._M_t.
                                         super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                                         .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>.
                                        _M_head_impl)->current + lVar26,0x800);
            }
            lVar26 = lVar26 + 0x98;
          }
          piVar2 = (idx_t *)&(_Var9._M_pi)->_M_use_count;
          *piVar2 = *piVar2 + 1;
          bVar11 = true;
        }
        else {
          for (uVar24 = 0;
              uVar24 < (ulong)((long)(pTVar23->column_ids).
                                     super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     .
                                     super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pTVar23->column_ids).
                                     super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     .
                                     super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar24 = uVar24 + 1) {
            bVar11 = ScanFilterInfo::ColumnHasFilters((ScanFilterInfo *)local_e0._M_i,uVar24);
            if (!bVar11) {
              pvVar14 = vector<duckdb::StorageIndex,_true>::get<true>(local_d0,uVar24);
              if (pvVar14->index == 0xffffffffffffffff) {
                pvVar18 = vector<duckdb::Vector,_true>::get<true>(&local_f8->data,uVar24);
                Vector::SetVectorType(pvVar18,FLAT_VECTOR);
                pvVar18 = vector<duckdb::Vector,_true>::get<true>(&local_f8->data,uVar24);
                pdVar5 = pvVar18->data;
                for (uVar19 = 0; uVar19 < approved_tuple_count; uVar19 = uVar19 + 1) {
                  uVar21 = uVar19;
                  if (sel.sel_vector != (sel_t *)0x0) {
                    uVar21 = (ulong)sel.sel_vector[uVar19];
                  }
                  *(ulong *)(pdVar5 + uVar19 * 8) =
                       (long)pp_Var22 + uVar21 + (this->super_SegmentBase<duckdb::RowGroup>).start;
                }
              }
              else {
                pCVar15 = GetColumn(this,pvVar14);
                iVar6 = *(idx_t *)&(local_e8._M_pi)->_M_use_count;
                _Var7._M_head_impl =
                     (((unsafe_unique_array<ColumnScanState> *)&local_e8._M_pi[1]._M_use_count)->
                     super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                     )._M_t.
                     super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                     .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl;
                pvVar18 = vector<duckdb::Vector,_true>::get<true>(&local_f8->data,uVar24);
                in_stack_fffffffffffffec8.ptr = in_stack_fffffffffffffec8.ptr & 0xffffffff00000000;
                (*pCVar15->_vptr_ColumnData[0xf])
                          (pCVar15,iVar6,_Var7._M_head_impl + uVar24,pvVar18,&sel,
                           approved_tuple_count,in_stack_fffffffffffffec8.ptr);
              }
            }
            pTVar23 = local_d8;
          }
          ScanFilterInfo::EndFilter((ScanFilterInfo *)local_e0._M_i,state_00);
          bVar11 = false;
          local_f0 = (element_type *)approved_tuple_count;
        }
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&sel.selection_data.internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_01._M_i = local_e0._M_i;
        if (iVar20 != 0) goto LAB_01aafbea;
      }
    }
    else {
      NextVector(this,(CollectionScanState *)_Var9._M_pi);
      bVar11 = true;
    }
    if (!bVar11) {
      return;
    }
  } while( true );
}

Assistant:

void RowGroup::TemplatedScan(TransactionData transaction, CollectionScanState &state, DataChunk &result) {
	const bool ALLOW_UPDATES = TYPE != TableScanType::TABLE_SCAN_COMMITTED_ROWS_DISALLOW_UPDATES &&
	                           TYPE != TableScanType::TABLE_SCAN_COMMITTED_ROWS_OMIT_PERMANENTLY_DELETED;
	const auto &column_ids = state.GetColumnIds();
	auto &filter_info = state.GetFilterInfo();
	while (true) {
		if (state.vector_index * STANDARD_VECTOR_SIZE >= state.max_row_group_row) {
			// exceeded the amount of rows to scan
			return;
		}
		idx_t current_row = state.vector_index * STANDARD_VECTOR_SIZE;
		auto max_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, state.max_row_group_row - current_row);

		// check the sampling info if we have to sample this chunk
		if (state.GetSamplingInfo().do_system_sample &&
		    state.random.NextRandom() > state.GetSamplingInfo().sample_rate) {
			NextVector(state);
			continue;
		}

		//! first check the zonemap if we have to scan this partition
		if (!CheckZonemapSegments(state)) {
			continue;
		}

		// second, scan the version chunk manager to figure out which tuples to load for this transaction
		idx_t count;
		if (TYPE == TableScanType::TABLE_SCAN_REGULAR) {
			count = state.row_group->GetSelVector(transaction, state.vector_index, state.valid_sel, max_count);
			if (count == 0) {
				// nothing to scan for this vector, skip the entire vector
				NextVector(state);
				continue;
			}
		} else if (TYPE == TableScanType::TABLE_SCAN_COMMITTED_ROWS_OMIT_PERMANENTLY_DELETED) {
			count = state.row_group->GetCommittedSelVector(transaction.start_time, transaction.transaction_id,
			                                               state.vector_index, state.valid_sel, max_count);
			if (count == 0) {
				// nothing to scan for this vector, skip the entire vector
				NextVector(state);
				continue;
			}
		} else {
			count = max_count;
		}
		auto &block_manager = GetBlockManager();
#ifndef DUCKDB_ALTERNATIVE_VERIFY
		// // in regular operation we only prefetch from remote file systems
		// // when alternative verify is set, we always prefetch for testing purposes
		if (block_manager.IsRemote())
#else
		if (!block_manager.InMemory())
#endif
		{
			PrefetchState prefetch_state;
			for (idx_t i = 0; i < column_ids.size(); i++) {
				const auto &column = column_ids[i];
				if (!column.IsRowIdColumn()) {
					GetColumn(column).InitializePrefetch(prefetch_state, state.column_scans[i], max_count);
				}
			}
			auto &buffer_manager = block_manager.buffer_manager;
			buffer_manager.Prefetch(prefetch_state.blocks);
		}

		bool has_filters = filter_info.HasFilters();
		if (count == max_count && !has_filters) {
			// scan all vectors completely: full scan without deletions or table filters
			for (idx_t i = 0; i < column_ids.size(); i++) {
				const auto &column = column_ids[i];
				if (column.IsRowIdColumn()) {
					// scan row id
					D_ASSERT(result.data[i].GetType().InternalType() == ROW_TYPE);
					result.data[i].Sequence(UnsafeNumericCast<int64_t>(this->start + current_row), 1, count);
				} else {
					auto &col_data = GetColumn(column);
					if (TYPE != TableScanType::TABLE_SCAN_REGULAR) {
						col_data.ScanCommitted(state.vector_index, state.column_scans[i], result.data[i],
						                       ALLOW_UPDATES);
					} else {
						col_data.Scan(transaction, state.vector_index, state.column_scans[i], result.data[i]);
					}
				}
			}
		} else {
			// partial scan: we have deletions or table filters
			idx_t approved_tuple_count = count;
			SelectionVector sel;
			if (count != max_count) {
				sel.Initialize(state.valid_sel);
			} else {
				sel.Initialize(nullptr);
			}
			//! first, we scan the columns with filters, fetch their data and generate a selection vector.
			//! get runtime statistics
			auto adaptive_filter = filter_info.GetAdaptiveFilter();
			auto filter_state = filter_info.BeginFilter();
			if (has_filters) {
				D_ASSERT(ALLOW_UPDATES);
				auto &filter_list = filter_info.GetFilterList();
				for (idx_t i = 0; i < filter_list.size(); i++) {
					auto filter_idx = adaptive_filter->permutation[i];
					auto &filter = filter_list[filter_idx];
					if (filter.IsAlwaysTrue()) {
						// this filter is always true - skip it
						continue;
					}
					auto &table_filter_state = *filter.filter_state;

					const auto scan_idx = filter.scan_column_index;
					const auto column_idx = filter.table_column_index;

					auto &result_vector = result.data[scan_idx];
					if (column_idx == COLUMN_IDENTIFIER_ROW_ID) {
						// We do another quick statistics scan for row ids here
						const auto rowid_start = this->start + current_row;
						const auto rowid_end = this->start + current_row + max_count;
						const auto prune_result = CheckRowIdFilter(filter.filter, rowid_start, rowid_end);
						if (prune_result == FilterPropagateResult::FILTER_ALWAYS_FALSE) {
							// We can just break out of the loop here.
							approved_tuple_count = 0;
							continue;
						}

						// Generate row ids
						// Create sequence for row ids
						D_ASSERT(result_vector.GetType().InternalType() == ROW_TYPE);
						result_vector.SetVectorType(VectorType::FLAT_VECTOR);
						auto result_data = FlatVector::GetData<int64_t>(result_vector);
						for (size_t sel_idx = 0; sel_idx < approved_tuple_count; sel_idx++) {
							result_data[sel.get_index(sel_idx)] =
							    UnsafeNumericCast<int64_t>(this->start + current_row + sel.get_index(sel_idx));
						}

						// Was this filter always true? If so, we dont need to apply it
						if (prune_result == FilterPropagateResult::FILTER_ALWAYS_TRUE) {
							continue;
						}

						// Now apply the filter
						UnifiedVectorFormat vdata;
						result_vector.ToUnifiedFormat(approved_tuple_count, vdata);
						ColumnSegment::FilterSelection(sel, result_vector, vdata, filter.filter, table_filter_state,
						                               approved_tuple_count, approved_tuple_count);

					} else {
						auto &col_data = GetColumn(filter.table_column_index);
						col_data.Filter(transaction, state.vector_index, state.column_scans[scan_idx], result_vector,
						                sel, approved_tuple_count, filter.filter, table_filter_state);
					}
				}
				for (auto &table_filter : filter_list) {
					if (table_filter.IsAlwaysTrue()) {
						continue;
					}
					result.data[table_filter.scan_column_index].Slice(sel, approved_tuple_count);
				}
			}
			if (approved_tuple_count == 0) {
				// all rows were filtered out by the table filters
				D_ASSERT(has_filters);
				result.Reset();
				// skip this vector in all the scans that were not scanned yet
				for (idx_t i = 0; i < column_ids.size(); i++) {
					auto &col_idx = column_ids[i];
					if (col_idx.IsRowIdColumn()) {
						continue;
					}
					if (has_filters && filter_info.ColumnHasFilters(i)) {
						continue;
					}
					auto &col_data = GetColumn(col_idx);
					col_data.Skip(state.column_scans[i]);
				}
				state.vector_index++;
				continue;
			}
			//! Now we use the selection vector to fetch data for the other columns.
			for (idx_t i = 0; i < column_ids.size(); i++) {
				if (has_filters && filter_info.ColumnHasFilters(i)) {
					// column has already been scanned as part of the filtering process
					continue;
				}
				auto &column = column_ids[i];
				if (column.IsRowIdColumn()) {
					D_ASSERT(result.data[i].GetType().InternalType() == ROW_TYPE);
					result.data[i].SetVectorType(VectorType::FLAT_VECTOR);
					auto result_data = FlatVector::GetData<int64_t>(result.data[i]);
					for (size_t sel_idx = 0; sel_idx < approved_tuple_count; sel_idx++) {
						result_data[sel_idx] =
						    UnsafeNumericCast<int64_t>(this->start + current_row + sel.get_index(sel_idx));
					}
				} else {
					auto &col_data = GetColumn(column);
					if (TYPE == TableScanType::TABLE_SCAN_REGULAR) {
						col_data.Select(transaction, state.vector_index, state.column_scans[i], result.data[i], sel,
						                approved_tuple_count);
					} else {
						col_data.SelectCommitted(state.vector_index, state.column_scans[i], result.data[i], sel,
						                         approved_tuple_count, ALLOW_UPDATES);
					}
				}
			}
			filter_info.EndFilter(filter_state);

			D_ASSERT(approved_tuple_count > 0);
			count = approved_tuple_count;
		}
		result.SetCardinality(count);
		state.vector_index++;
		break;
	}
}